

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdcat.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  bsdcat bsdcat_storage;
  
  bsdcat_storage.argc = 0;
  bsdcat_storage._20_4_ = 0;
  bsdcat_storage.argv = (char **)0x0;
  bsdcat_storage.getopt_state = 0;
  bsdcat_storage._4_4_ = 0;
  bsdcat_storage.getopt_word = (char *)0x0;
  bsdcat_storage.argument = (char *)0x0;
  lafe_setprogname(*argv,"bsdcat");
  bsdcat_storage.argc = argc;
  bsdcat_storage.argv = argv;
  iVar1 = bsdcat_getopt(&bsdcat_storage);
  if (iVar1 == -1) {
    bsdcat_next();
    pcVar2 = *bsdcat_storage.argv;
    if (pcVar2 == (char *)0x0) {
      bsdcat_current_path = "<stdin>";
      bsdcat_read_to_stdout((char *)0x0);
    }
    else {
      while (pcVar2 != (char *)0x0) {
        bsdcat_current_path = *bsdcat_storage.argv;
        bsdcat_storage.argv = bsdcat_storage.argv + 1;
        bsdcat_read_to_stdout(bsdcat_current_path);
        bsdcat_next();
        pcVar2 = *bsdcat_storage.argv;
      }
      archive_read_free(a);
    }
    exit((uint)exit_status);
  }
  if (iVar1 != 0) {
    if (iVar1 == 0x68) {
      usage(_stdout,0);
    }
    usage(_stderr,1);
  }
  version();
}

Assistant:

int
main(int argc, char **argv)
{
	struct bsdcat *bsdcat, bsdcat_storage;
	int c;

	bsdcat = &bsdcat_storage;
	memset(bsdcat, 0, sizeof(*bsdcat));

	lafe_setprogname(*argv, "bsdcat");

	bsdcat->argv = argv;
	bsdcat->argc = argc;

	while ((c = bsdcat_getopt(bsdcat)) != -1) {
		switch (c) {
		case 'h':
			usage(stdout, 0);
			/* NOTREACHED */
			/* Fallthrough */
		case OPTION_VERSION:
			version();
			/* NOTREACHED */
			/* Fallthrough */
		default:
			usage(stderr, 1);
			/* Fallthrough */
			/* NOTREACHED */
		}
	}

	bsdcat_next();
	if (*bsdcat->argv == NULL) {
		bsdcat_current_path = "<stdin>";
		bsdcat_read_to_stdout(NULL);
	} else {
		while (*bsdcat->argv) {
			bsdcat_current_path = *bsdcat->argv++;
			bsdcat_read_to_stdout(bsdcat_current_path);
			bsdcat_next();
		}
		archive_read_free(a); /* Help valgrind & friends */
	}

	exit(exit_status);
}